

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O1

void __thiscall dg::dda::RWNodeCall::_summarizeAnnotation(RWNodeCall *this)

{
  pointer pRVar1;
  RWNode *pRVar2;
  iterator iVar3;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *__range5;
  const_iterator __begin3;
  pointer pRVar4;
  const_iterator __end3;
  ulong uVar5;
  RWNode **ppRVar6;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> undefined;
  RWNode *uc;
  RWNode **local_a8;
  iterator iStack_a0;
  RWNode **local_98;
  RWNode *local_90 [2];
  _Link_type local_80;
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  local_60;
  
  pRVar4 = (this->callees).
           super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->callees).
           super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0x10 < (ulong)((long)pRVar1 - (long)pRVar4)) {
    local_a8 = (RWNode **)0x0;
    iStack_a0._M_current = (RWNode **)0x0;
    local_98 = (RWNode **)0x0;
    if (pRVar4 != pRVar1) {
      do {
        local_90[0] = pRVar4->calledValue;
        if (local_90[0] != (RWNode *)0x0) {
          if (iStack_a0._M_current == local_98) {
            std::vector<dg::dda::RWNode_const*,std::allocator<dg::dda::RWNode_const*>>::
            _M_realloc_insert<dg::dda::RWNode_const*const&>
                      ((vector<dg::dda::RWNode_const*,std::allocator<dg::dda::RWNode_const*>> *)
                       &local_a8,iStack_a0,local_90);
          }
          else {
            *iStack_a0._M_current = local_90[0];
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
        }
        pRVar4 = pRVar4 + 1;
      } while (pRVar4 != pRVar1);
    }
    if ((long)iStack_a0._M_current - (long)local_a8 == 8) {
      pRVar2 = *local_a8;
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::operator=((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(this->super_RWNode).annotations,
                  (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&pRVar2->annotations);
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::operator=((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(this->super_RWNode).annotations.overwrites,
                  (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(pRVar2->annotations).overwrites);
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::operator=((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(this->super_RWNode).annotations.uses,
                  (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(pRVar2->annotations).uses);
    }
    else if (8 < (ulong)((long)iStack_a0._M_current - (long)local_a8)) {
      DefSiteSet::intersect
                ((DefSiteSet *)local_90,&((*local_a8)->annotations).overwrites,
                 &(local_a8[1]->annotations).overwrites);
      if (0x10 < (ulong)((long)iStack_a0._M_current - (long)local_a8)) {
        uVar5 = 2;
        do {
          DefSiteSet::intersect
                    ((DefSiteSet *)&local_60,(DefSiteSet *)local_90,
                     &(local_a8[uVar5]->annotations).overwrites);
          std::
          set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ::operator=((set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                       *)local_90,
                      (set<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                       *)&local_60);
          std::
          _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ::_M_erase(&local_60,
                     (_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)iStack_a0._M_current - (long)local_a8 >> 3));
      }
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::operator=((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(this->super_RWNode).annotations.overwrites,
                  (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)local_90);
      iVar3._M_current = iStack_a0._M_current;
      if (local_a8 != iStack_a0._M_current) {
        ppRVar6 = local_a8;
        do {
          pRVar2 = *ppRVar6;
          DefSiteSet::add<dg::dda::DefSiteSet>
                    (&(this->super_RWNode).annotations.defs,&(pRVar2->annotations).defs);
          DefSiteSet::add<dg::dda::DefSiteSet>
                    (&(this->super_RWNode).annotations.uses,&(pRVar2->annotations).uses);
          ppRVar6 = ppRVar6 + 1;
        } while (ppRVar6 != iVar3._M_current);
      }
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::_M_erase((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                  *)local_90,local_80);
    }
    if (local_a8 != (RWNode **)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
  }
  this->_annotations_summarized = true;
  return;
}

Assistant:

void _summarizeAnnotation() const {
        if (callees.size() > 1) {
            std::vector<const RWNode *> undefined;
            for (const auto &cv : callees) {
                if (const auto *uc = cv.getCalledValue()) {
                    undefined.push_back(uc);
                }
            }

            if (undefined.size() == 1) {
                annotations = undefined[0]->annotations;
            } else if (undefined.size() > 1) {
                auto kills = undefined[0]->annotations.overwrites.intersect(
                        undefined[1]->annotations.overwrites);
                for (size_t i = 2; i < undefined.size(); ++i) {
                    kills = kills.intersect(
                            undefined[i]->annotations.overwrites);
                }

                annotations.overwrites = kills;
                for (const auto *u : undefined) {
                    annotations.defs.add(u->annotations.defs);
                    annotations.uses.add(u->annotations.uses);
                }
            }
        }
        _annotations_summarized = true;
    }